

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

bool is_same(vector<double,_std::allocator<double>_> *vec1,
            vector<double,_std::allocator<double>_> *vec2)

{
  uint uVar1;
  uint uVar2;
  vector<double,_std::allocator<double>_> *vec2_local;
  vector<double,_std::allocator<double>_> *vec1_local;
  
  uVar1 = max_index(vec1);
  uVar2 = max_index(vec2);
  return uVar1 == uVar2;
}

Assistant:

bool is_same(const std::vector<double>& vec1, const std::vector<double>& vec2){
    return max_index(vec1)==max_index(vec2);
}